

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LeopardCommon.cpp
# Opt level: O3

void leopard::xor_mem4(void *vx_0,void *vy_0,void *vx_1,void *vy_1,void *vx_2,void *vy_2,void *vx_3,
                      void *vy_3,uint64_t bytes)

{
  uint *puVar1;
  uint *puVar2;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  uint uVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uint uVar53;
  uint uVar54;
  uint uVar55;
  uint uVar56;
  uint uVar57;
  uint uVar58;
  uint uVar59;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  uint uVar64;
  uint uVar65;
  uint uVar66;
  long lVar67;
  uint64_t uVar68;
  
  if (CpuHasAVX2 == '\0') {
    uVar68 = 0;
    do {
      puVar1 = (uint *)((long)vy_0 + uVar68);
      uVar4 = puVar1[1];
      uVar5 = puVar1[2];
      uVar6 = puVar1[3];
      puVar2 = (uint *)((long)vy_0 + uVar68 + 0x10);
      uVar7 = *puVar2;
      uVar8 = puVar2[1];
      uVar9 = puVar2[2];
      uVar10 = puVar2[3];
      puVar2 = (uint *)((long)vy_0 + uVar68 + 0x20);
      uVar11 = *puVar2;
      uVar12 = puVar2[1];
      uVar13 = puVar2[2];
      uVar14 = puVar2[3];
      puVar2 = (uint *)((long)vy_0 + uVar68 + 0x30);
      uVar15 = *puVar2;
      uVar16 = puVar2[1];
      uVar17 = puVar2[2];
      uVar18 = puVar2[3];
      puVar2 = (uint *)((long)vx_0 + uVar68);
      uVar19 = puVar2[1];
      uVar20 = puVar2[2];
      uVar21 = puVar2[3];
      puVar3 = (uint *)((long)vx_0 + uVar68 + 0x10);
      uVar22 = *puVar3;
      uVar23 = puVar3[1];
      uVar24 = puVar3[2];
      uVar25 = puVar3[3];
      puVar3 = (uint *)((long)vx_0 + uVar68 + 0x20);
      uVar26 = *puVar3;
      uVar27 = puVar3[1];
      uVar28 = puVar3[2];
      uVar29 = puVar3[3];
      puVar3 = (uint *)((long)vx_0 + uVar68 + 0x30);
      uVar30 = *puVar3;
      uVar31 = puVar3[1];
      uVar32 = puVar3[2];
      uVar33 = puVar3[3];
      puVar3 = (uint *)((long)vx_0 + uVar68);
      *puVar3 = *puVar1 ^ *puVar2;
      puVar3[1] = uVar4 ^ uVar19;
      puVar3[2] = uVar5 ^ uVar20;
      puVar3[3] = uVar6 ^ uVar21;
      puVar1 = (uint *)((long)vx_0 + uVar68 + 0x10);
      *puVar1 = uVar7 ^ uVar22;
      puVar1[1] = uVar8 ^ uVar23;
      puVar1[2] = uVar9 ^ uVar24;
      puVar1[3] = uVar10 ^ uVar25;
      puVar1 = (uint *)((long)vx_0 + uVar68 + 0x20);
      *puVar1 = uVar11 ^ uVar26;
      puVar1[1] = uVar12 ^ uVar27;
      puVar1[2] = uVar13 ^ uVar28;
      puVar1[3] = uVar14 ^ uVar29;
      puVar1 = (uint *)((long)vy_1 + uVar68);
      uVar4 = *puVar1;
      uVar5 = puVar1[1];
      uVar6 = puVar1[2];
      uVar7 = puVar1[3];
      puVar1 = (uint *)((long)vy_1 + uVar68 + 0x10);
      uVar8 = *puVar1;
      uVar9 = puVar1[1];
      uVar10 = puVar1[2];
      uVar11 = puVar1[3];
      puVar1 = (uint *)((long)vy_1 + uVar68 + 0x20);
      uVar12 = *puVar1;
      uVar13 = puVar1[1];
      uVar14 = puVar1[2];
      uVar19 = puVar1[3];
      puVar1 = (uint *)((long)vx_0 + uVar68 + 0x30);
      *puVar1 = uVar15 ^ uVar30;
      puVar1[1] = uVar16 ^ uVar31;
      puVar1[2] = uVar17 ^ uVar32;
      puVar1[3] = uVar18 ^ uVar33;
      puVar1 = (uint *)((long)vy_1 + uVar68 + 0x30);
      uVar15 = *puVar1;
      uVar16 = puVar1[1];
      uVar17 = puVar1[2];
      uVar18 = puVar1[3];
      puVar1 = (uint *)((long)vx_1 + uVar68);
      uVar20 = puVar1[1];
      uVar21 = puVar1[2];
      uVar22 = puVar1[3];
      puVar2 = (uint *)((long)vx_1 + uVar68 + 0x10);
      uVar23 = *puVar2;
      uVar24 = puVar2[1];
      uVar25 = puVar2[2];
      uVar26 = puVar2[3];
      puVar2 = (uint *)((long)vx_1 + uVar68 + 0x20);
      uVar27 = *puVar2;
      uVar28 = puVar2[1];
      uVar29 = puVar2[2];
      uVar30 = puVar2[3];
      puVar2 = (uint *)((long)vx_1 + uVar68 + 0x30);
      uVar31 = *puVar2;
      uVar32 = puVar2[1];
      uVar33 = puVar2[2];
      uVar34 = puVar2[3];
      puVar2 = (uint *)((long)vx_1 + uVar68);
      *puVar2 = uVar4 ^ *puVar1;
      puVar2[1] = uVar5 ^ uVar20;
      puVar2[2] = uVar6 ^ uVar21;
      puVar2[3] = uVar7 ^ uVar22;
      puVar1 = (uint *)((long)vx_1 + uVar68 + 0x10);
      *puVar1 = uVar8 ^ uVar23;
      puVar1[1] = uVar9 ^ uVar24;
      puVar1[2] = uVar10 ^ uVar25;
      puVar1[3] = uVar11 ^ uVar26;
      puVar1 = (uint *)((long)vx_1 + uVar68 + 0x20);
      *puVar1 = uVar12 ^ uVar27;
      puVar1[1] = uVar13 ^ uVar28;
      puVar1[2] = uVar14 ^ uVar29;
      puVar1[3] = uVar19 ^ uVar30;
      puVar1 = (uint *)((long)vy_2 + uVar68);
      uVar4 = *puVar1;
      uVar5 = puVar1[1];
      uVar6 = puVar1[2];
      uVar7 = puVar1[3];
      puVar1 = (uint *)((long)vy_2 + uVar68 + 0x10);
      uVar8 = *puVar1;
      uVar9 = puVar1[1];
      uVar10 = puVar1[2];
      uVar11 = puVar1[3];
      puVar1 = (uint *)((long)vy_2 + uVar68 + 0x20);
      uVar12 = *puVar1;
      uVar13 = puVar1[1];
      uVar14 = puVar1[2];
      uVar19 = puVar1[3];
      puVar1 = (uint *)((long)vx_1 + uVar68 + 0x30);
      *puVar1 = uVar15 ^ uVar31;
      puVar1[1] = uVar16 ^ uVar32;
      puVar1[2] = uVar17 ^ uVar33;
      puVar1[3] = uVar18 ^ uVar34;
      puVar1 = (uint *)((long)vy_2 + uVar68 + 0x30);
      uVar15 = *puVar1;
      uVar16 = puVar1[1];
      uVar17 = puVar1[2];
      uVar18 = puVar1[3];
      puVar1 = (uint *)((long)vx_2 + uVar68);
      uVar20 = puVar1[1];
      uVar21 = puVar1[2];
      uVar22 = puVar1[3];
      puVar2 = (uint *)((long)vx_2 + uVar68 + 0x10);
      uVar23 = *puVar2;
      uVar24 = puVar2[1];
      uVar25 = puVar2[2];
      uVar26 = puVar2[3];
      puVar2 = (uint *)((long)vx_2 + uVar68 + 0x20);
      uVar27 = *puVar2;
      uVar28 = puVar2[1];
      uVar29 = puVar2[2];
      uVar30 = puVar2[3];
      puVar2 = (uint *)((long)vx_2 + uVar68 + 0x30);
      uVar31 = *puVar2;
      uVar32 = puVar2[1];
      uVar33 = puVar2[2];
      uVar34 = puVar2[3];
      puVar2 = (uint *)((long)vx_2 + uVar68);
      *puVar2 = uVar4 ^ *puVar1;
      puVar2[1] = uVar5 ^ uVar20;
      puVar2[2] = uVar6 ^ uVar21;
      puVar2[3] = uVar7 ^ uVar22;
      puVar1 = (uint *)((long)vx_2 + uVar68 + 0x10);
      *puVar1 = uVar8 ^ uVar23;
      puVar1[1] = uVar9 ^ uVar24;
      puVar1[2] = uVar10 ^ uVar25;
      puVar1[3] = uVar11 ^ uVar26;
      puVar1 = (uint *)((long)vx_2 + uVar68 + 0x20);
      *puVar1 = uVar12 ^ uVar27;
      puVar1[1] = uVar13 ^ uVar28;
      puVar1[2] = uVar14 ^ uVar29;
      puVar1[3] = uVar19 ^ uVar30;
      puVar1 = (uint *)((long)vy_3 + uVar68);
      uVar4 = *puVar1;
      uVar5 = puVar1[1];
      uVar6 = puVar1[2];
      uVar7 = puVar1[3];
      puVar1 = (uint *)((long)vy_3 + uVar68 + 0x10);
      uVar8 = *puVar1;
      uVar9 = puVar1[1];
      uVar10 = puVar1[2];
      uVar11 = puVar1[3];
      puVar1 = (uint *)((long)vy_3 + uVar68 + 0x20);
      uVar12 = *puVar1;
      uVar13 = puVar1[1];
      uVar14 = puVar1[2];
      uVar19 = puVar1[3];
      puVar1 = (uint *)((long)vx_2 + uVar68 + 0x30);
      *puVar1 = uVar15 ^ uVar31;
      puVar1[1] = uVar16 ^ uVar32;
      puVar1[2] = uVar17 ^ uVar33;
      puVar1[3] = uVar18 ^ uVar34;
      puVar1 = (uint *)((long)vy_3 + uVar68 + 0x30);
      uVar15 = *puVar1;
      uVar16 = puVar1[1];
      uVar17 = puVar1[2];
      uVar18 = puVar1[3];
      puVar1 = (uint *)((long)vx_3 + uVar68);
      uVar20 = puVar1[1];
      uVar21 = puVar1[2];
      uVar22 = puVar1[3];
      puVar2 = (uint *)((long)vx_3 + uVar68 + 0x10);
      uVar23 = *puVar2;
      uVar24 = puVar2[1];
      uVar25 = puVar2[2];
      uVar26 = puVar2[3];
      puVar2 = (uint *)((long)vx_3 + uVar68 + 0x20);
      uVar27 = *puVar2;
      uVar28 = puVar2[1];
      uVar29 = puVar2[2];
      uVar30 = puVar2[3];
      puVar2 = (uint *)((long)vx_3 + uVar68 + 0x30);
      uVar31 = *puVar2;
      uVar32 = puVar2[1];
      uVar33 = puVar2[2];
      uVar34 = puVar2[3];
      puVar2 = (uint *)((long)vx_3 + uVar68);
      *puVar2 = uVar4 ^ *puVar1;
      puVar2[1] = uVar5 ^ uVar20;
      puVar2[2] = uVar6 ^ uVar21;
      puVar2[3] = uVar7 ^ uVar22;
      puVar1 = (uint *)((long)vx_3 + uVar68 + 0x10);
      *puVar1 = uVar8 ^ uVar23;
      puVar1[1] = uVar9 ^ uVar24;
      puVar1[2] = uVar10 ^ uVar25;
      puVar1[3] = uVar11 ^ uVar26;
      puVar1 = (uint *)((long)vx_3 + uVar68 + 0x20);
      *puVar1 = uVar12 ^ uVar27;
      puVar1[1] = uVar13 ^ uVar28;
      puVar1[2] = uVar14 ^ uVar29;
      puVar1[3] = uVar19 ^ uVar30;
      puVar1 = (uint *)((long)vx_3 + uVar68 + 0x30);
      *puVar1 = uVar15 ^ uVar31;
      puVar1[1] = uVar16 ^ uVar32;
      puVar1[2] = uVar17 ^ uVar33;
      puVar1[3] = uVar18 ^ uVar34;
      uVar68 = uVar68 + 0x40;
    } while (bytes != uVar68);
  }
  else {
    if (0x7f < bytes) {
      lVar67 = 0;
      do {
        puVar1 = (uint *)((long)vy_0 + lVar67);
        uVar4 = puVar1[1];
        uVar5 = puVar1[2];
        uVar6 = puVar1[3];
        uVar7 = puVar1[4];
        uVar8 = puVar1[5];
        uVar9 = puVar1[6];
        uVar10 = puVar1[7];
        puVar2 = (uint *)((long)vy_0 + lVar67 + 0x20);
        uVar11 = *puVar2;
        uVar12 = puVar2[1];
        uVar13 = puVar2[2];
        uVar14 = puVar2[3];
        uVar15 = puVar2[4];
        uVar16 = puVar2[5];
        uVar17 = puVar2[6];
        uVar18 = puVar2[7];
        puVar2 = (uint *)((long)vy_0 + lVar67 + 0x40);
        uVar19 = *puVar2;
        uVar20 = puVar2[1];
        uVar21 = puVar2[2];
        uVar22 = puVar2[3];
        uVar23 = puVar2[4];
        uVar24 = puVar2[5];
        uVar25 = puVar2[6];
        uVar26 = puVar2[7];
        puVar2 = (uint *)((long)vy_0 + lVar67 + 0x60);
        uVar27 = *puVar2;
        uVar28 = puVar2[1];
        uVar29 = puVar2[2];
        uVar30 = puVar2[3];
        uVar31 = puVar2[4];
        uVar32 = puVar2[5];
        uVar33 = puVar2[6];
        uVar34 = puVar2[7];
        bytes = bytes - 0x80;
        puVar2 = (uint *)((long)vx_0 + lVar67);
        uVar35 = puVar2[1];
        uVar36 = puVar2[2];
        uVar37 = puVar2[3];
        uVar38 = puVar2[4];
        uVar39 = puVar2[5];
        uVar40 = puVar2[6];
        uVar41 = puVar2[7];
        puVar3 = (uint *)((long)vx_0 + lVar67 + 0x20);
        uVar42 = *puVar3;
        uVar43 = puVar3[1];
        uVar44 = puVar3[2];
        uVar45 = puVar3[3];
        uVar46 = puVar3[4];
        uVar47 = puVar3[5];
        uVar48 = puVar3[6];
        uVar49 = puVar3[7];
        puVar3 = (uint *)((long)vx_0 + lVar67 + 0x40);
        uVar50 = *puVar3;
        uVar51 = puVar3[1];
        uVar52 = puVar3[2];
        uVar53 = puVar3[3];
        uVar54 = puVar3[4];
        uVar55 = puVar3[5];
        uVar56 = puVar3[6];
        uVar57 = puVar3[7];
        puVar3 = (uint *)((long)vx_0 + lVar67 + 0x60);
        uVar58 = *puVar3;
        uVar59 = puVar3[1];
        uVar60 = puVar3[2];
        uVar61 = puVar3[3];
        uVar62 = puVar3[4];
        uVar63 = puVar3[5];
        uVar64 = puVar3[6];
        uVar65 = puVar3[7];
        puVar3 = (uint *)((long)vx_0 + lVar67);
        *puVar3 = *puVar1 ^ *puVar2;
        puVar3[1] = uVar4 ^ uVar35;
        puVar3[2] = uVar5 ^ uVar36;
        puVar3[3] = uVar6 ^ uVar37;
        puVar3[4] = uVar7 ^ uVar38;
        puVar3[5] = uVar8 ^ uVar39;
        puVar3[6] = uVar9 ^ uVar40;
        puVar3[7] = uVar10 ^ uVar41;
        puVar1 = (uint *)((long)vx_0 + lVar67 + 0x20);
        *puVar1 = uVar11 ^ uVar42;
        puVar1[1] = uVar12 ^ uVar43;
        puVar1[2] = uVar13 ^ uVar44;
        puVar1[3] = uVar14 ^ uVar45;
        puVar1[4] = uVar15 ^ uVar46;
        puVar1[5] = uVar16 ^ uVar47;
        puVar1[6] = uVar17 ^ uVar48;
        puVar1[7] = uVar18 ^ uVar49;
        puVar1 = (uint *)((long)vx_0 + lVar67 + 0x40);
        *puVar1 = uVar19 ^ uVar50;
        puVar1[1] = uVar20 ^ uVar51;
        puVar1[2] = uVar21 ^ uVar52;
        puVar1[3] = uVar22 ^ uVar53;
        puVar1[4] = uVar23 ^ uVar54;
        puVar1[5] = uVar24 ^ uVar55;
        puVar1[6] = uVar25 ^ uVar56;
        puVar1[7] = uVar26 ^ uVar57;
        puVar1 = (uint *)((long)vy_1 + lVar67);
        uVar4 = *puVar1;
        uVar5 = puVar1[1];
        uVar6 = puVar1[2];
        uVar7 = puVar1[3];
        uVar8 = puVar1[4];
        uVar9 = puVar1[5];
        uVar10 = puVar1[6];
        uVar11 = puVar1[7];
        puVar1 = (uint *)((long)vy_1 + lVar67 + 0x20);
        uVar12 = *puVar1;
        uVar13 = puVar1[1];
        uVar14 = puVar1[2];
        uVar15 = puVar1[3];
        uVar16 = puVar1[4];
        uVar17 = puVar1[5];
        uVar18 = puVar1[6];
        uVar19 = puVar1[7];
        puVar1 = (uint *)((long)vy_1 + lVar67 + 0x40);
        uVar20 = *puVar1;
        uVar21 = puVar1[1];
        uVar22 = puVar1[2];
        uVar23 = puVar1[3];
        uVar24 = puVar1[4];
        uVar25 = puVar1[5];
        uVar26 = puVar1[6];
        uVar35 = puVar1[7];
        puVar1 = (uint *)((long)vx_0 + lVar67 + 0x60);
        *puVar1 = uVar27 ^ uVar58;
        puVar1[1] = uVar28 ^ uVar59;
        puVar1[2] = uVar29 ^ uVar60;
        puVar1[3] = uVar30 ^ uVar61;
        puVar1[4] = uVar31 ^ uVar62;
        puVar1[5] = uVar32 ^ uVar63;
        puVar1[6] = uVar33 ^ uVar64;
        puVar1[7] = uVar34 ^ uVar65;
        puVar1 = (uint *)((long)vy_1 + lVar67 + 0x60);
        uVar27 = *puVar1;
        uVar28 = puVar1[1];
        uVar29 = puVar1[2];
        uVar30 = puVar1[3];
        uVar31 = puVar1[4];
        uVar32 = puVar1[5];
        uVar33 = puVar1[6];
        uVar34 = puVar1[7];
        puVar1 = (uint *)((long)vx_1 + lVar67);
        uVar36 = puVar1[1];
        uVar37 = puVar1[2];
        uVar38 = puVar1[3];
        uVar39 = puVar1[4];
        uVar40 = puVar1[5];
        uVar41 = puVar1[6];
        uVar42 = puVar1[7];
        puVar2 = (uint *)((long)vx_1 + lVar67 + 0x20);
        uVar43 = *puVar2;
        uVar44 = puVar2[1];
        uVar45 = puVar2[2];
        uVar46 = puVar2[3];
        uVar47 = puVar2[4];
        uVar48 = puVar2[5];
        uVar49 = puVar2[6];
        uVar50 = puVar2[7];
        puVar2 = (uint *)((long)vx_1 + lVar67 + 0x40);
        uVar51 = *puVar2;
        uVar52 = puVar2[1];
        uVar53 = puVar2[2];
        uVar54 = puVar2[3];
        uVar55 = puVar2[4];
        uVar56 = puVar2[5];
        uVar57 = puVar2[6];
        uVar58 = puVar2[7];
        puVar2 = (uint *)((long)vx_1 + lVar67 + 0x60);
        uVar59 = *puVar2;
        uVar60 = puVar2[1];
        uVar61 = puVar2[2];
        uVar62 = puVar2[3];
        uVar63 = puVar2[4];
        uVar64 = puVar2[5];
        uVar65 = puVar2[6];
        uVar66 = puVar2[7];
        puVar2 = (uint *)((long)vx_1 + lVar67);
        *puVar2 = uVar4 ^ *puVar1;
        puVar2[1] = uVar5 ^ uVar36;
        puVar2[2] = uVar6 ^ uVar37;
        puVar2[3] = uVar7 ^ uVar38;
        puVar2[4] = uVar8 ^ uVar39;
        puVar2[5] = uVar9 ^ uVar40;
        puVar2[6] = uVar10 ^ uVar41;
        puVar2[7] = uVar11 ^ uVar42;
        puVar1 = (uint *)((long)vx_1 + lVar67 + 0x20);
        *puVar1 = uVar12 ^ uVar43;
        puVar1[1] = uVar13 ^ uVar44;
        puVar1[2] = uVar14 ^ uVar45;
        puVar1[3] = uVar15 ^ uVar46;
        puVar1[4] = uVar16 ^ uVar47;
        puVar1[5] = uVar17 ^ uVar48;
        puVar1[6] = uVar18 ^ uVar49;
        puVar1[7] = uVar19 ^ uVar50;
        puVar1 = (uint *)((long)vx_1 + lVar67 + 0x40);
        *puVar1 = uVar20 ^ uVar51;
        puVar1[1] = uVar21 ^ uVar52;
        puVar1[2] = uVar22 ^ uVar53;
        puVar1[3] = uVar23 ^ uVar54;
        puVar1[4] = uVar24 ^ uVar55;
        puVar1[5] = uVar25 ^ uVar56;
        puVar1[6] = uVar26 ^ uVar57;
        puVar1[7] = uVar35 ^ uVar58;
        puVar1 = (uint *)((long)vy_2 + lVar67);
        uVar4 = *puVar1;
        uVar5 = puVar1[1];
        uVar6 = puVar1[2];
        uVar7 = puVar1[3];
        uVar8 = puVar1[4];
        uVar9 = puVar1[5];
        uVar10 = puVar1[6];
        uVar11 = puVar1[7];
        puVar1 = (uint *)((long)vy_2 + lVar67 + 0x20);
        uVar12 = *puVar1;
        uVar13 = puVar1[1];
        uVar14 = puVar1[2];
        uVar15 = puVar1[3];
        uVar16 = puVar1[4];
        uVar17 = puVar1[5];
        uVar18 = puVar1[6];
        uVar19 = puVar1[7];
        puVar1 = (uint *)((long)vy_2 + lVar67 + 0x40);
        uVar20 = *puVar1;
        uVar21 = puVar1[1];
        uVar22 = puVar1[2];
        uVar23 = puVar1[3];
        uVar24 = puVar1[4];
        uVar25 = puVar1[5];
        uVar26 = puVar1[6];
        uVar35 = puVar1[7];
        puVar1 = (uint *)((long)vx_1 + lVar67 + 0x60);
        *puVar1 = uVar27 ^ uVar59;
        puVar1[1] = uVar28 ^ uVar60;
        puVar1[2] = uVar29 ^ uVar61;
        puVar1[3] = uVar30 ^ uVar62;
        puVar1[4] = uVar31 ^ uVar63;
        puVar1[5] = uVar32 ^ uVar64;
        puVar1[6] = uVar33 ^ uVar65;
        puVar1[7] = uVar34 ^ uVar66;
        puVar1 = (uint *)((long)vy_2 + lVar67 + 0x60);
        uVar27 = *puVar1;
        uVar28 = puVar1[1];
        uVar29 = puVar1[2];
        uVar30 = puVar1[3];
        uVar31 = puVar1[4];
        uVar32 = puVar1[5];
        uVar33 = puVar1[6];
        uVar34 = puVar1[7];
        puVar1 = (uint *)((long)vx_2 + lVar67);
        uVar36 = puVar1[1];
        uVar37 = puVar1[2];
        uVar38 = puVar1[3];
        uVar39 = puVar1[4];
        uVar40 = puVar1[5];
        uVar41 = puVar1[6];
        uVar42 = puVar1[7];
        puVar2 = (uint *)((long)vx_2 + lVar67 + 0x20);
        uVar43 = *puVar2;
        uVar44 = puVar2[1];
        uVar45 = puVar2[2];
        uVar46 = puVar2[3];
        uVar47 = puVar2[4];
        uVar48 = puVar2[5];
        uVar49 = puVar2[6];
        uVar50 = puVar2[7];
        puVar2 = (uint *)((long)vx_2 + lVar67 + 0x40);
        uVar51 = *puVar2;
        uVar52 = puVar2[1];
        uVar53 = puVar2[2];
        uVar54 = puVar2[3];
        uVar55 = puVar2[4];
        uVar56 = puVar2[5];
        uVar57 = puVar2[6];
        uVar58 = puVar2[7];
        puVar2 = (uint *)((long)vx_2 + lVar67 + 0x60);
        uVar59 = *puVar2;
        uVar60 = puVar2[1];
        uVar61 = puVar2[2];
        uVar62 = puVar2[3];
        uVar63 = puVar2[4];
        uVar64 = puVar2[5];
        uVar65 = puVar2[6];
        uVar66 = puVar2[7];
        puVar2 = (uint *)((long)vx_2 + lVar67);
        *puVar2 = uVar4 ^ *puVar1;
        puVar2[1] = uVar5 ^ uVar36;
        puVar2[2] = uVar6 ^ uVar37;
        puVar2[3] = uVar7 ^ uVar38;
        puVar2[4] = uVar8 ^ uVar39;
        puVar2[5] = uVar9 ^ uVar40;
        puVar2[6] = uVar10 ^ uVar41;
        puVar2[7] = uVar11 ^ uVar42;
        puVar1 = (uint *)((long)vx_2 + lVar67 + 0x20);
        *puVar1 = uVar12 ^ uVar43;
        puVar1[1] = uVar13 ^ uVar44;
        puVar1[2] = uVar14 ^ uVar45;
        puVar1[3] = uVar15 ^ uVar46;
        puVar1[4] = uVar16 ^ uVar47;
        puVar1[5] = uVar17 ^ uVar48;
        puVar1[6] = uVar18 ^ uVar49;
        puVar1[7] = uVar19 ^ uVar50;
        puVar1 = (uint *)((long)vx_2 + lVar67 + 0x40);
        *puVar1 = uVar20 ^ uVar51;
        puVar1[1] = uVar21 ^ uVar52;
        puVar1[2] = uVar22 ^ uVar53;
        puVar1[3] = uVar23 ^ uVar54;
        puVar1[4] = uVar24 ^ uVar55;
        puVar1[5] = uVar25 ^ uVar56;
        puVar1[6] = uVar26 ^ uVar57;
        puVar1[7] = uVar35 ^ uVar58;
        puVar1 = (uint *)((long)vy_3 + lVar67);
        uVar4 = *puVar1;
        uVar5 = puVar1[1];
        uVar6 = puVar1[2];
        uVar7 = puVar1[3];
        uVar8 = puVar1[4];
        uVar9 = puVar1[5];
        uVar10 = puVar1[6];
        uVar11 = puVar1[7];
        puVar1 = (uint *)((long)vy_3 + lVar67 + 0x20);
        uVar12 = *puVar1;
        uVar13 = puVar1[1];
        uVar14 = puVar1[2];
        uVar15 = puVar1[3];
        uVar16 = puVar1[4];
        uVar17 = puVar1[5];
        uVar18 = puVar1[6];
        uVar19 = puVar1[7];
        puVar1 = (uint *)((long)vy_3 + lVar67 + 0x40);
        uVar20 = *puVar1;
        uVar21 = puVar1[1];
        uVar22 = puVar1[2];
        uVar23 = puVar1[3];
        uVar24 = puVar1[4];
        uVar25 = puVar1[5];
        uVar26 = puVar1[6];
        uVar35 = puVar1[7];
        puVar1 = (uint *)((long)vx_2 + lVar67 + 0x60);
        *puVar1 = uVar27 ^ uVar59;
        puVar1[1] = uVar28 ^ uVar60;
        puVar1[2] = uVar29 ^ uVar61;
        puVar1[3] = uVar30 ^ uVar62;
        puVar1[4] = uVar31 ^ uVar63;
        puVar1[5] = uVar32 ^ uVar64;
        puVar1[6] = uVar33 ^ uVar65;
        puVar1[7] = uVar34 ^ uVar66;
        puVar1 = (uint *)((long)vy_3 + lVar67 + 0x60);
        uVar27 = *puVar1;
        uVar28 = puVar1[1];
        uVar29 = puVar1[2];
        uVar30 = puVar1[3];
        uVar31 = puVar1[4];
        uVar32 = puVar1[5];
        uVar33 = puVar1[6];
        uVar34 = puVar1[7];
        puVar1 = (uint *)((long)vx_3 + lVar67);
        uVar36 = puVar1[1];
        uVar37 = puVar1[2];
        uVar38 = puVar1[3];
        uVar39 = puVar1[4];
        uVar40 = puVar1[5];
        uVar41 = puVar1[6];
        uVar42 = puVar1[7];
        puVar2 = (uint *)((long)vx_3 + lVar67 + 0x20);
        uVar43 = *puVar2;
        uVar44 = puVar2[1];
        uVar45 = puVar2[2];
        uVar46 = puVar2[3];
        uVar47 = puVar2[4];
        uVar48 = puVar2[5];
        uVar49 = puVar2[6];
        uVar50 = puVar2[7];
        puVar2 = (uint *)((long)vx_3 + lVar67 + 0x40);
        uVar51 = *puVar2;
        uVar52 = puVar2[1];
        uVar53 = puVar2[2];
        uVar54 = puVar2[3];
        uVar55 = puVar2[4];
        uVar56 = puVar2[5];
        uVar57 = puVar2[6];
        uVar58 = puVar2[7];
        puVar2 = (uint *)((long)vx_3 + lVar67 + 0x60);
        uVar59 = *puVar2;
        uVar60 = puVar2[1];
        uVar61 = puVar2[2];
        uVar62 = puVar2[3];
        uVar63 = puVar2[4];
        uVar64 = puVar2[5];
        uVar65 = puVar2[6];
        uVar66 = puVar2[7];
        puVar2 = (uint *)((long)vx_3 + lVar67);
        *puVar2 = uVar4 ^ *puVar1;
        puVar2[1] = uVar5 ^ uVar36;
        puVar2[2] = uVar6 ^ uVar37;
        puVar2[3] = uVar7 ^ uVar38;
        puVar2[4] = uVar8 ^ uVar39;
        puVar2[5] = uVar9 ^ uVar40;
        puVar2[6] = uVar10 ^ uVar41;
        puVar2[7] = uVar11 ^ uVar42;
        puVar1 = (uint *)((long)vx_3 + lVar67 + 0x20);
        *puVar1 = uVar12 ^ uVar43;
        puVar1[1] = uVar13 ^ uVar44;
        puVar1[2] = uVar14 ^ uVar45;
        puVar1[3] = uVar15 ^ uVar46;
        puVar1[4] = uVar16 ^ uVar47;
        puVar1[5] = uVar17 ^ uVar48;
        puVar1[6] = uVar18 ^ uVar49;
        puVar1[7] = uVar19 ^ uVar50;
        puVar1 = (uint *)((long)vx_3 + lVar67 + 0x40);
        *puVar1 = uVar20 ^ uVar51;
        puVar1[1] = uVar21 ^ uVar52;
        puVar1[2] = uVar22 ^ uVar53;
        puVar1[3] = uVar23 ^ uVar54;
        puVar1[4] = uVar24 ^ uVar55;
        puVar1[5] = uVar25 ^ uVar56;
        puVar1[6] = uVar26 ^ uVar57;
        puVar1[7] = uVar35 ^ uVar58;
        puVar1 = (uint *)((long)vx_3 + lVar67 + 0x60);
        *puVar1 = uVar27 ^ uVar59;
        puVar1[1] = uVar28 ^ uVar60;
        puVar1[2] = uVar29 ^ uVar61;
        puVar1[3] = uVar30 ^ uVar62;
        puVar1[4] = uVar31 ^ uVar63;
        puVar1[5] = uVar32 ^ uVar64;
        puVar1[6] = uVar33 ^ uVar65;
        puVar1[7] = uVar34 ^ uVar66;
        lVar67 = lVar67 + 0x80;
      } while (0x7f < bytes);
      vx_0 = (void *)((long)vx_0 + lVar67);
      vy_0 = (void *)((long)vy_0 + lVar67);
      vx_1 = (void *)((long)vx_1 + lVar67);
      vy_1 = (void *)((long)vy_1 + lVar67);
      vx_2 = (void *)((long)vx_2 + lVar67);
      vy_2 = (void *)((long)vy_2 + lVar67);
      vx_3 = (void *)((long)vx_3 + lVar67);
      vy_3 = (void *)((long)vy_3 + lVar67);
    }
    if (bytes != 0) {
      uVar4 = *(uint *)((long)vy_0 + 4);
      uVar5 = *(uint *)((long)vy_0 + 8);
      uVar6 = *(uint *)((long)vy_0 + 0xc);
      uVar7 = *(uint *)((long)vy_0 + 0x10);
      uVar8 = *(uint *)((long)vy_0 + 0x14);
      uVar9 = *(uint *)((long)vy_0 + 0x18);
      uVar10 = *(uint *)((long)vy_0 + 0x1c);
      uVar11 = *(uint *)((long)vy_0 + 0x20);
      uVar12 = *(uint *)((long)vy_0 + 0x24);
      uVar13 = *(uint *)((long)vy_0 + 0x28);
      uVar14 = *(uint *)((long)vy_0 + 0x2c);
      uVar15 = *(uint *)((long)vy_0 + 0x30);
      uVar16 = *(uint *)((long)vy_0 + 0x34);
      uVar17 = *(uint *)((long)vy_0 + 0x38);
      uVar18 = *(uint *)((long)vy_0 + 0x3c);
      uVar19 = *vy_1;
      uVar20 = *(uint *)((long)vy_1 + 4);
      uVar21 = *(uint *)((long)vy_1 + 8);
      uVar22 = *(uint *)((long)vy_1 + 0xc);
      uVar23 = *(uint *)((long)vy_1 + 0x10);
      uVar24 = *(uint *)((long)vy_1 + 0x14);
      uVar25 = *(uint *)((long)vy_1 + 0x18);
      uVar26 = *(uint *)((long)vy_1 + 0x1c);
      uVar27 = *(uint *)((long)vy_1 + 0x20);
      uVar28 = *(uint *)((long)vy_1 + 0x24);
      uVar29 = *(uint *)((long)vy_1 + 0x28);
      uVar30 = *(uint *)((long)vy_1 + 0x2c);
      uVar31 = *(uint *)((long)vy_1 + 0x30);
      uVar32 = *(uint *)((long)vy_1 + 0x34);
      uVar33 = *(uint *)((long)vy_1 + 0x38);
      uVar34 = *(uint *)((long)vy_1 + 0x3c);
      uVar35 = *(uint *)((long)vx_0 + 0x20);
      uVar36 = *(uint *)((long)vx_0 + 0x24);
      uVar37 = *(uint *)((long)vx_0 + 0x28);
      uVar38 = *(uint *)((long)vx_0 + 0x2c);
      uVar39 = *(uint *)((long)vx_0 + 0x30);
      uVar40 = *(uint *)((long)vx_0 + 0x34);
      uVar41 = *(uint *)((long)vx_0 + 0x38);
      uVar42 = *(uint *)((long)vx_0 + 0x3c);
      uVar43 = *vx_1;
      uVar44 = *(uint *)((long)vx_1 + 4);
      uVar45 = *(uint *)((long)vx_1 + 8);
      uVar46 = *(uint *)((long)vx_1 + 0xc);
      uVar47 = *(uint *)((long)vx_1 + 0x10);
      uVar48 = *(uint *)((long)vx_1 + 0x14);
      uVar49 = *(uint *)((long)vx_1 + 0x18);
      uVar50 = *(uint *)((long)vx_1 + 0x1c);
      uVar51 = *(uint *)((long)vx_1 + 0x20);
      uVar52 = *(uint *)((long)vx_1 + 0x24);
      uVar53 = *(uint *)((long)vx_1 + 0x28);
      uVar54 = *(uint *)((long)vx_1 + 0x2c);
      uVar55 = *(uint *)((long)vx_1 + 0x30);
      uVar56 = *(uint *)((long)vx_1 + 0x34);
      uVar57 = *(uint *)((long)vx_1 + 0x38);
      uVar58 = *(uint *)((long)vx_1 + 0x3c);
      *(uint *)vx_0 = *vy_0 ^ *vx_0;
      *(uint *)((long)vx_0 + 4) = uVar4 ^ *(uint *)((long)vx_0 + 4);
      *(uint *)((long)vx_0 + 8) = uVar5 ^ *(uint *)((long)vx_0 + 8);
      *(uint *)((long)vx_0 + 0xc) = uVar6 ^ *(uint *)((long)vx_0 + 0xc);
      *(uint *)((long)vx_0 + 0x10) = uVar7 ^ *(uint *)((long)vx_0 + 0x10);
      *(uint *)((long)vx_0 + 0x14) = uVar8 ^ *(uint *)((long)vx_0 + 0x14);
      *(uint *)((long)vx_0 + 0x18) = uVar9 ^ *(uint *)((long)vx_0 + 0x18);
      *(uint *)((long)vx_0 + 0x1c) = uVar10 ^ *(uint *)((long)vx_0 + 0x1c);
      *(uint *)vx_1 = uVar19 ^ uVar43;
      *(uint *)((long)vx_1 + 4) = uVar20 ^ uVar44;
      *(uint *)((long)vx_1 + 8) = uVar21 ^ uVar45;
      *(uint *)((long)vx_1 + 0xc) = uVar22 ^ uVar46;
      *(uint *)((long)vx_1 + 0x10) = uVar23 ^ uVar47;
      *(uint *)((long)vx_1 + 0x14) = uVar24 ^ uVar48;
      *(uint *)((long)vx_1 + 0x18) = uVar25 ^ uVar49;
      *(uint *)((long)vx_1 + 0x1c) = uVar26 ^ uVar50;
      uVar4 = *vy_2;
      uVar5 = *(uint *)((long)vy_2 + 4);
      uVar6 = *(uint *)((long)vy_2 + 8);
      uVar7 = *(uint *)((long)vy_2 + 0xc);
      uVar8 = *(uint *)((long)vy_2 + 0x10);
      uVar9 = *(uint *)((long)vy_2 + 0x14);
      uVar10 = *(uint *)((long)vy_2 + 0x18);
      uVar19 = *(uint *)((long)vy_2 + 0x1c);
      uVar20 = *vy_3;
      uVar21 = *(uint *)((long)vy_3 + 4);
      uVar22 = *(uint *)((long)vy_3 + 8);
      uVar23 = *(uint *)((long)vy_3 + 0xc);
      uVar24 = *(uint *)((long)vy_3 + 0x10);
      uVar25 = *(uint *)((long)vy_3 + 0x14);
      uVar26 = *(uint *)((long)vy_3 + 0x18);
      uVar43 = *(uint *)((long)vy_3 + 0x1c);
      *(uint *)((long)vx_0 + 0x20) = uVar11 ^ uVar35;
      *(uint *)((long)vx_0 + 0x24) = uVar12 ^ uVar36;
      *(uint *)((long)vx_0 + 0x28) = uVar13 ^ uVar37;
      *(uint *)((long)vx_0 + 0x2c) = uVar14 ^ uVar38;
      *(uint *)((long)vx_0 + 0x30) = uVar15 ^ uVar39;
      *(uint *)((long)vx_0 + 0x34) = uVar16 ^ uVar40;
      *(uint *)((long)vx_0 + 0x38) = uVar17 ^ uVar41;
      *(uint *)((long)vx_0 + 0x3c) = uVar18 ^ uVar42;
      uVar11 = *(uint *)((long)vy_2 + 0x20);
      uVar12 = *(uint *)((long)vy_2 + 0x24);
      uVar13 = *(uint *)((long)vy_2 + 0x28);
      uVar14 = *(uint *)((long)vy_2 + 0x2c);
      uVar15 = *(uint *)((long)vy_2 + 0x30);
      uVar16 = *(uint *)((long)vy_2 + 0x34);
      uVar17 = *(uint *)((long)vy_2 + 0x38);
      uVar18 = *(uint *)((long)vy_2 + 0x3c);
      *(uint *)((long)vx_1 + 0x20) = uVar27 ^ uVar51;
      *(uint *)((long)vx_1 + 0x24) = uVar28 ^ uVar52;
      *(uint *)((long)vx_1 + 0x28) = uVar29 ^ uVar53;
      *(uint *)((long)vx_1 + 0x2c) = uVar30 ^ uVar54;
      *(uint *)((long)vx_1 + 0x30) = uVar31 ^ uVar55;
      *(uint *)((long)vx_1 + 0x34) = uVar32 ^ uVar56;
      *(uint *)((long)vx_1 + 0x38) = uVar33 ^ uVar57;
      *(uint *)((long)vx_1 + 0x3c) = uVar34 ^ uVar58;
      uVar27 = *(uint *)((long)vy_3 + 0x20);
      uVar28 = *(uint *)((long)vy_3 + 0x24);
      uVar29 = *(uint *)((long)vy_3 + 0x28);
      uVar30 = *(uint *)((long)vy_3 + 0x2c);
      uVar31 = *(uint *)((long)vy_3 + 0x30);
      uVar32 = *(uint *)((long)vy_3 + 0x34);
      uVar33 = *(uint *)((long)vy_3 + 0x38);
      uVar34 = *(uint *)((long)vy_3 + 0x3c);
      uVar35 = *(uint *)((long)vx_2 + 0x20);
      uVar36 = *(uint *)((long)vx_2 + 0x24);
      uVar37 = *(uint *)((long)vx_2 + 0x28);
      uVar38 = *(uint *)((long)vx_2 + 0x2c);
      uVar39 = *(uint *)((long)vx_2 + 0x30);
      uVar40 = *(uint *)((long)vx_2 + 0x34);
      uVar41 = *(uint *)((long)vx_2 + 0x38);
      uVar42 = *(uint *)((long)vx_2 + 0x3c);
      uVar44 = *vx_3;
      uVar45 = *(uint *)((long)vx_3 + 4);
      uVar46 = *(uint *)((long)vx_3 + 8);
      uVar47 = *(uint *)((long)vx_3 + 0xc);
      uVar48 = *(uint *)((long)vx_3 + 0x10);
      uVar49 = *(uint *)((long)vx_3 + 0x14);
      uVar50 = *(uint *)((long)vx_3 + 0x18);
      uVar51 = *(uint *)((long)vx_3 + 0x1c);
      uVar52 = *(uint *)((long)vx_3 + 0x20);
      uVar53 = *(uint *)((long)vx_3 + 0x24);
      uVar54 = *(uint *)((long)vx_3 + 0x28);
      uVar55 = *(uint *)((long)vx_3 + 0x2c);
      uVar56 = *(uint *)((long)vx_3 + 0x30);
      uVar57 = *(uint *)((long)vx_3 + 0x34);
      uVar58 = *(uint *)((long)vx_3 + 0x38);
      uVar59 = *(uint *)((long)vx_3 + 0x3c);
      *(uint *)vx_2 = uVar4 ^ *vx_2;
      *(uint *)((long)vx_2 + 4) = uVar5 ^ *(uint *)((long)vx_2 + 4);
      *(uint *)((long)vx_2 + 8) = uVar6 ^ *(uint *)((long)vx_2 + 8);
      *(uint *)((long)vx_2 + 0xc) = uVar7 ^ *(uint *)((long)vx_2 + 0xc);
      *(uint *)((long)vx_2 + 0x10) = uVar8 ^ *(uint *)((long)vx_2 + 0x10);
      *(uint *)((long)vx_2 + 0x14) = uVar9 ^ *(uint *)((long)vx_2 + 0x14);
      *(uint *)((long)vx_2 + 0x18) = uVar10 ^ *(uint *)((long)vx_2 + 0x18);
      *(uint *)((long)vx_2 + 0x1c) = uVar19 ^ *(uint *)((long)vx_2 + 0x1c);
      *(uint *)vx_3 = uVar20 ^ uVar44;
      *(uint *)((long)vx_3 + 4) = uVar21 ^ uVar45;
      *(uint *)((long)vx_3 + 8) = uVar22 ^ uVar46;
      *(uint *)((long)vx_3 + 0xc) = uVar23 ^ uVar47;
      *(uint *)((long)vx_3 + 0x10) = uVar24 ^ uVar48;
      *(uint *)((long)vx_3 + 0x14) = uVar25 ^ uVar49;
      *(uint *)((long)vx_3 + 0x18) = uVar26 ^ uVar50;
      *(uint *)((long)vx_3 + 0x1c) = uVar43 ^ uVar51;
      *(uint *)((long)vx_2 + 0x20) = uVar11 ^ uVar35;
      *(uint *)((long)vx_2 + 0x24) = uVar12 ^ uVar36;
      *(uint *)((long)vx_2 + 0x28) = uVar13 ^ uVar37;
      *(uint *)((long)vx_2 + 0x2c) = uVar14 ^ uVar38;
      *(uint *)((long)vx_2 + 0x30) = uVar15 ^ uVar39;
      *(uint *)((long)vx_2 + 0x34) = uVar16 ^ uVar40;
      *(uint *)((long)vx_2 + 0x38) = uVar17 ^ uVar41;
      *(uint *)((long)vx_2 + 0x3c) = uVar18 ^ uVar42;
      *(uint *)((long)vx_3 + 0x20) = uVar27 ^ uVar52;
      *(uint *)((long)vx_3 + 0x24) = uVar28 ^ uVar53;
      *(uint *)((long)vx_3 + 0x28) = uVar29 ^ uVar54;
      *(uint *)((long)vx_3 + 0x2c) = uVar30 ^ uVar55;
      *(uint *)((long)vx_3 + 0x30) = uVar31 ^ uVar56;
      *(uint *)((long)vx_3 + 0x34) = uVar32 ^ uVar57;
      *(uint *)((long)vx_3 + 0x38) = uVar33 ^ uVar58;
      *(uint *)((long)vx_3 + 0x3c) = uVar34 ^ uVar59;
    }
  }
  return;
}

Assistant:

void xor_mem4(
    void * LEO_RESTRICT vx_0, const void * LEO_RESTRICT vy_0,
    void * LEO_RESTRICT vx_1, const void * LEO_RESTRICT vy_1,
    void * LEO_RESTRICT vx_2, const void * LEO_RESTRICT vy_2,
    void * LEO_RESTRICT vx_3, const void * LEO_RESTRICT vy_3,
    uint64_t bytes)
{
#if defined(LEO_TRY_AVX2)
    if (CpuHasAVX2)
    {
        LEO_M256 * LEO_RESTRICT       x32_0 = reinterpret_cast<LEO_M256 *>      (vx_0);
        const LEO_M256 * LEO_RESTRICT y32_0 = reinterpret_cast<const LEO_M256 *>(vy_0);
        LEO_M256 * LEO_RESTRICT       x32_1 = reinterpret_cast<LEO_M256 *>      (vx_1);
        const LEO_M256 * LEO_RESTRICT y32_1 = reinterpret_cast<const LEO_M256 *>(vy_1);
        LEO_M256 * LEO_RESTRICT       x32_2 = reinterpret_cast<LEO_M256 *>      (vx_2);
        const LEO_M256 * LEO_RESTRICT y32_2 = reinterpret_cast<const LEO_M256 *>(vy_2);
        LEO_M256 * LEO_RESTRICT       x32_3 = reinterpret_cast<LEO_M256 *>      (vx_3);
        const LEO_M256 * LEO_RESTRICT y32_3 = reinterpret_cast<const LEO_M256 *>(vy_3);
        while (bytes >= 128)
        {
            const LEO_M256 x0_0 = _mm256_xor_si256(_mm256_loadu_si256(x32_0),     _mm256_loadu_si256(y32_0));
            const LEO_M256 x1_0 = _mm256_xor_si256(_mm256_loadu_si256(x32_0 + 1), _mm256_loadu_si256(y32_0 + 1));
            const LEO_M256 x2_0 = _mm256_xor_si256(_mm256_loadu_si256(x32_0 + 2), _mm256_loadu_si256(y32_0 + 2));
            const LEO_M256 x3_0 = _mm256_xor_si256(_mm256_loadu_si256(x32_0 + 3), _mm256_loadu_si256(y32_0 + 3));
            _mm256_storeu_si256(x32_0, x0_0);
            _mm256_storeu_si256(x32_0 + 1, x1_0);
            _mm256_storeu_si256(x32_0 + 2, x2_0);
            _mm256_storeu_si256(x32_0 + 3, x3_0);
            x32_0 += 4, y32_0 += 4;
            const LEO_M256 x0_1 = _mm256_xor_si256(_mm256_loadu_si256(x32_1),     _mm256_loadu_si256(y32_1));
            const LEO_M256 x1_1 = _mm256_xor_si256(_mm256_loadu_si256(x32_1 + 1), _mm256_loadu_si256(y32_1 + 1));
            const LEO_M256 x2_1 = _mm256_xor_si256(_mm256_loadu_si256(x32_1 + 2), _mm256_loadu_si256(y32_1 + 2));
            const LEO_M256 x3_1 = _mm256_xor_si256(_mm256_loadu_si256(x32_1 + 3), _mm256_loadu_si256(y32_1 + 3));
            _mm256_storeu_si256(x32_1, x0_1);
            _mm256_storeu_si256(x32_1 + 1, x1_1);
            _mm256_storeu_si256(x32_1 + 2, x2_1);
            _mm256_storeu_si256(x32_1 + 3, x3_1);
            x32_1 += 4, y32_1 += 4;
            const LEO_M256 x0_2 = _mm256_xor_si256(_mm256_loadu_si256(x32_2),     _mm256_loadu_si256(y32_2));
            const LEO_M256 x1_2 = _mm256_xor_si256(_mm256_loadu_si256(x32_2 + 1), _mm256_loadu_si256(y32_2 + 1));
            const LEO_M256 x2_2 = _mm256_xor_si256(_mm256_loadu_si256(x32_2 + 2), _mm256_loadu_si256(y32_2 + 2));
            const LEO_M256 x3_2 = _mm256_xor_si256(_mm256_loadu_si256(x32_2 + 3), _mm256_loadu_si256(y32_2 + 3));
            _mm256_storeu_si256(x32_2, x0_2);
            _mm256_storeu_si256(x32_2 + 1, x1_2);
            _mm256_storeu_si256(x32_2 + 2, x2_2);
            _mm256_storeu_si256(x32_2 + 3, x3_2);
            x32_2 += 4, y32_2 += 4;
            const LEO_M256 x0_3 = _mm256_xor_si256(_mm256_loadu_si256(x32_3),     _mm256_loadu_si256(y32_3));
            const LEO_M256 x1_3 = _mm256_xor_si256(_mm256_loadu_si256(x32_3 + 1), _mm256_loadu_si256(y32_3 + 1));
            const LEO_M256 x2_3 = _mm256_xor_si256(_mm256_loadu_si256(x32_3 + 2), _mm256_loadu_si256(y32_3 + 2));
            const LEO_M256 x3_3 = _mm256_xor_si256(_mm256_loadu_si256(x32_3 + 3), _mm256_loadu_si256(y32_3 + 3));
            _mm256_storeu_si256(x32_3,     x0_3);
            _mm256_storeu_si256(x32_3 + 1, x1_3);
            _mm256_storeu_si256(x32_3 + 2, x2_3);
            _mm256_storeu_si256(x32_3 + 3, x3_3);
            x32_3 += 4, y32_3 += 4;
            bytes -= 128;
        }
        if (bytes > 0)
        {
            const LEO_M256 x0_0 = _mm256_xor_si256(_mm256_loadu_si256(x32_0),     _mm256_loadu_si256(y32_0));
            const LEO_M256 x1_0 = _mm256_xor_si256(_mm256_loadu_si256(x32_0 + 1), _mm256_loadu_si256(y32_0 + 1));
            const LEO_M256 x0_1 = _mm256_xor_si256(_mm256_loadu_si256(x32_1),     _mm256_loadu_si256(y32_1));
            const LEO_M256 x1_1 = _mm256_xor_si256(_mm256_loadu_si256(x32_1 + 1), _mm256_loadu_si256(y32_1 + 1));
            _mm256_storeu_si256(x32_0, x0_0);
            _mm256_storeu_si256(x32_0 + 1, x1_0);
            _mm256_storeu_si256(x32_1, x0_1);
            _mm256_storeu_si256(x32_1 + 1, x1_1);
            const LEO_M256 x0_2 = _mm256_xor_si256(_mm256_loadu_si256(x32_2),     _mm256_loadu_si256(y32_2));
            const LEO_M256 x1_2 = _mm256_xor_si256(_mm256_loadu_si256(x32_2 + 1), _mm256_loadu_si256(y32_2 + 1));
            const LEO_M256 x0_3 = _mm256_xor_si256(_mm256_loadu_si256(x32_3),     _mm256_loadu_si256(y32_3));
            const LEO_M256 x1_3 = _mm256_xor_si256(_mm256_loadu_si256(x32_3 + 1), _mm256_loadu_si256(y32_3 + 1));
            _mm256_storeu_si256(x32_2,     x0_2);
            _mm256_storeu_si256(x32_2 + 1, x1_2);
            _mm256_storeu_si256(x32_3,     x0_3);
            _mm256_storeu_si256(x32_3 + 1, x1_3);
        }
        return;
    }
#endif // LEO_TRY_AVX2
    LEO_M128 * LEO_RESTRICT       x16_0 = reinterpret_cast<LEO_M128 *>      (vx_0);
    const LEO_M128 * LEO_RESTRICT y16_0 = reinterpret_cast<const LEO_M128 *>(vy_0);
    LEO_M128 * LEO_RESTRICT       x16_1 = reinterpret_cast<LEO_M128 *>      (vx_1);
    const LEO_M128 * LEO_RESTRICT y16_1 = reinterpret_cast<const LEO_M128 *>(vy_1);
    LEO_M128 * LEO_RESTRICT       x16_2 = reinterpret_cast<LEO_M128 *>      (vx_2);
    const LEO_M128 * LEO_RESTRICT y16_2 = reinterpret_cast<const LEO_M128 *>(vy_2);
    LEO_M128 * LEO_RESTRICT       x16_3 = reinterpret_cast<LEO_M128 *>      (vx_3);
    const LEO_M128 * LEO_RESTRICT y16_3 = reinterpret_cast<const LEO_M128 *>(vy_3);
    do
    {
        const LEO_M128 x0_0 = _mm_xor_si128(_mm_loadu_si128(x16_0),     _mm_loadu_si128(y16_0));
        const LEO_M128 x1_0 = _mm_xor_si128(_mm_loadu_si128(x16_0 + 1), _mm_loadu_si128(y16_0 + 1));
        const LEO_M128 x2_0 = _mm_xor_si128(_mm_loadu_si128(x16_0 + 2), _mm_loadu_si128(y16_0 + 2));
        const LEO_M128 x3_0 = _mm_xor_si128(_mm_loadu_si128(x16_0 + 3), _mm_loadu_si128(y16_0 + 3));
        _mm_storeu_si128(x16_0, x0_0);
        _mm_storeu_si128(x16_0 + 1, x1_0);
        _mm_storeu_si128(x16_0 + 2, x2_0);
        _mm_storeu_si128(x16_0 + 3, x3_0);
        x16_0 += 4, y16_0 += 4;
        const LEO_M128 x0_1 = _mm_xor_si128(_mm_loadu_si128(x16_1),     _mm_loadu_si128(y16_1));
        const LEO_M128 x1_1 = _mm_xor_si128(_mm_loadu_si128(x16_1 + 1), _mm_loadu_si128(y16_1 + 1));
        const LEO_M128 x2_1 = _mm_xor_si128(_mm_loadu_si128(x16_1 + 2), _mm_loadu_si128(y16_1 + 2));
        const LEO_M128 x3_1 = _mm_xor_si128(_mm_loadu_si128(x16_1 + 3), _mm_loadu_si128(y16_1 + 3));
        _mm_storeu_si128(x16_1, x0_1);
        _mm_storeu_si128(x16_1 + 1, x1_1);
        _mm_storeu_si128(x16_1 + 2, x2_1);
        _mm_storeu_si128(x16_1 + 3, x3_1);
        x16_1 += 4, y16_1 += 4;
        const LEO_M128 x0_2 = _mm_xor_si128(_mm_loadu_si128(x16_2),     _mm_loadu_si128(y16_2));
        const LEO_M128 x1_2 = _mm_xor_si128(_mm_loadu_si128(x16_2 + 1), _mm_loadu_si128(y16_2 + 1));
        const LEO_M128 x2_2 = _mm_xor_si128(_mm_loadu_si128(x16_2 + 2), _mm_loadu_si128(y16_2 + 2));
        const LEO_M128 x3_2 = _mm_xor_si128(_mm_loadu_si128(x16_2 + 3), _mm_loadu_si128(y16_2 + 3));
        _mm_storeu_si128(x16_2, x0_2);
        _mm_storeu_si128(x16_2 + 1, x1_2);
        _mm_storeu_si128(x16_2 + 2, x2_2);
        _mm_storeu_si128(x16_2 + 3, x3_2);
        x16_2 += 4, y16_2 += 4;
        const LEO_M128 x0_3 = _mm_xor_si128(_mm_loadu_si128(x16_3),     _mm_loadu_si128(y16_3));
        const LEO_M128 x1_3 = _mm_xor_si128(_mm_loadu_si128(x16_3 + 1), _mm_loadu_si128(y16_3 + 1));
        const LEO_M128 x2_3 = _mm_xor_si128(_mm_loadu_si128(x16_3 + 2), _mm_loadu_si128(y16_3 + 2));
        const LEO_M128 x3_3 = _mm_xor_si128(_mm_loadu_si128(x16_3 + 3), _mm_loadu_si128(y16_3 + 3));
        _mm_storeu_si128(x16_3,     x0_3);
        _mm_storeu_si128(x16_3 + 1, x1_3);
        _mm_storeu_si128(x16_3 + 2, x2_3);
        _mm_storeu_si128(x16_3 + 3, x3_3);
        x16_3 += 4, y16_3 += 4;
        bytes -= 64;
    } while (bytes > 0);
}